

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void __thiscall extsector_t::Serialize(extsector_t *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  pFVar1 = ::operator<<(arc,(TArray<sector_t_*,_sector_t_*> *)this);
  pFVar1 = ::operator<<(pFVar1,&(this->Midtex).Floor.AttachedLines);
  pFVar1 = ::operator<<(pFVar1,(TArray<sector_t_*,_sector_t_*> *)&this->Midtex);
  pFVar1 = ::operator<<(pFVar1,&(this->Midtex).Ceiling.AttachedLines);
  pFVar1 = ::operator<<(pFVar1,&(this->Midtex).Ceiling.AttachedSectors);
  pFVar1 = ::operator<<(pFVar1,(TArray<FLinkedSector,_FLinkedSector> *)&this->Linked);
  ::operator<<(pFVar1,&(this->Linked).Ceiling.Sectors);
  return;
}

Assistant:

void extsector_t::Serialize(FArchive &arc)
{
	arc << FakeFloor.Sectors
		<< Midtex.Floor.AttachedLines 
		<< Midtex.Floor.AttachedSectors
		<< Midtex.Ceiling.AttachedLines
		<< Midtex.Ceiling.AttachedSectors
		<< Linked.Floor.Sectors
		<< Linked.Ceiling.Sectors;
}